

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picPageAnalyzer.cpp
# Opt level: O1

string * __thiscall
picPageAnalyzer::getOriginalPicSourceURL_abi_cxx11_
          (string *__return_storage_ptr__,picPageAnalyzer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint uVar3;
  char cVar4;
  ulong uVar5;
  string result_middle;
  string local_98;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Download original","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"href=\"","");
  pageAnalyzer::getInfoFromContent
            (&local_78,&this->super_pageAnalyzer,&local_98,-1,0x12,&local_50,'\"');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_98._M_dataplus._M_p = (pointer)paVar1;
  local_58 = &__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"&amp;","");
  uVar3 = std::__cxx11::string::find((char *)&local_78,(ulong)local_98._M_dataplus._M_p,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (uVar3 != 0xffffffff) {
    do {
      __return_storage_ptr__->_M_string_length = 0;
      *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
      cVar4 = (char)__return_storage_ptr__;
      if ((int)uVar3 < 1) {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        do {
          std::__cxx11::string::push_back(cVar4);
          uVar5 = uVar5 + 1;
        } while ((uVar3 & 0x7fffffff) != uVar5);
      }
      std::__cxx11::string::push_back(cVar4);
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"&amp;","");
      iVar2 = (int)local_98._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      for (uVar5 = (ulong)((int)uVar5 + iVar2); uVar5 < local_78._M_string_length; uVar5 = uVar5 + 1
          ) {
        std::__cxx11::string::push_back(cVar4);
      }
      std::__cxx11::string::_M_assign((string *)&local_78);
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"&amp;","");
      uVar3 = std::__cxx11::string::find((char *)&local_78,(ulong)local_98._M_dataplus._M_p,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    } while (uVar3 != 0xffffffff);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string picPageAnalyzer::getOriginalPicSourceURL()
{
    std::string result_middle = this->getInfoFromContent(std::string("Download original"), -1, GETMODE_PART, std::string("href=\""), '\"');
    std::string result = std::string("");

    //Part to handle special character "&amp;". It will be replaced by a more uniform function in the future
    int errpos = result_middle.find(std::string("&amp;"));
    while(errpos != std::string::npos)
    {
        result.clear();
        int rpos = 0;
        for(rpos = 0; rpos < errpos; rpos++)
            result += result_middle[rpos];

        result += result_middle[errpos];

        rpos += std::string("&amp;").length();

        for(; rpos < result_middle.length(); rpos++)
            result += result_middle[rpos];

        result_middle = result;

        errpos = result_middle.find(std::string("&amp;"));
    }
    return result;
}